

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lodtalk.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  VMContext *pVVar1;
  string *psVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  anon_class_1_0_00000001 local_c1;
  function<void_(Lodtalk::InterpreterProxy_*)> local_c0;
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [32];
  undefined4 local_50;
  int local_3c;
  string local_38 [4];
  int i;
  string scriptFilename;
  char **argv_local;
  int argc_local;
  
  context = (VMContext *)Lodtalk::createVMContext();
  std::__cxx11::string::string(local_38);
  local_3c = 1;
  do {
    if (argc <= local_3c) {
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        loadKernel();
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"-");
        psVar2 = _stdin;
        pVVar1 = context;
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_70,"stdin",&local_71);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_98,".",&local_99);
          Lodtalk::VMContext::executeScriptFromFile((_IO_FILE *)pVVar1,psVar2,local_70);
          std::__cxx11::string::~string(local_98);
          std::allocator<char>::~allocator((allocator<char> *)&local_99);
          std::__cxx11::string::~string(local_70);
          std::allocator<char>::~allocator((allocator<char> *)&local_71);
        }
        else {
          Lodtalk::VMContext::executeScriptFromFileNamed((string *)context);
        }
        pVVar1 = context;
        std::function<void(Lodtalk::InterpreterProxy*)>::function<main::__0,void>
                  ((function<void(Lodtalk::InterpreterProxy*)> *)&local_c0,&local_c1);
        Lodtalk::VMContext::withInterpreter((function *)pVVar1);
        std::function<void_(Lodtalk::InterpreterProxy_*)>::~function(&local_c0);
        argv_local._4_4_ = 0;
      }
      else {
        printHelp();
        argv_local._4_4_ = -1;
      }
LAB_001025e7:
      local_50 = 1;
      std::__cxx11::string::~string(local_38);
      return argv_local._4_4_;
    }
    iVar4 = strcmp(argv[local_3c],"-help");
    if (iVar4 == 0) {
LAB_0010239b:
      printHelp();
      argv_local._4_4_ = 0;
      goto LAB_001025e7;
    }
    iVar4 = strcmp(argv[local_3c],"-h");
    if (iVar4 == 0) goto LAB_0010239b;
    std::__cxx11::string::operator=(local_38,argv[local_3c]);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

int main(int argc, const char *argv[])
{
    context = createVMContext();

    std::string scriptFilename;

    for(int i = 1; i < argc; ++i)
    {
        if(!strcmp(argv[i], "-help") ||
           !strcmp(argv[i], "-h"))
        {
            printHelp();
            return 0;
        }
        else
        {
            scriptFilename = argv[i];
        }
    }

    if(scriptFilename.empty())
    {
        printHelp();
        return -1;
    }

    // Execute the kernel script
    loadKernel();

    // Execute the source script.
    if(scriptFilename == "-")
    {
        // Execute script from the standard input.
        context->executeScriptFromFile(stdin, "stdin");
    }
    else
    {
        // Execute the script from the file.
        context->executeScriptFromFileNamed(scriptFilename);
    }

    // Call the main function.
    context->withInterpreter([&](InterpreterProxy *interpreter) {
        interpreter->pushOop(context->getGlobalContext());
        interpreter->sendMessageWithSelector(context->makeSelector("main"), 0);
        interpreter->popOop();
    });
    return 0;
}